

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanCommandBuffer.cpp
# Opt level: O0

void __thiscall VulkanUtilities::VulkanCommandBuffer::FlushBarriers(VulkanCommandBuffer *this)

{
  VkCommandBuffer pVVar1;
  PFN_vkCmdPipelineBarrier p_Var2;
  undefined4 uVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  Char *pCVar7;
  size_type sVar8;
  char (*in_RCX) [32];
  VkImageMemoryBarrier *local_f0;
  VkMemoryBarrier *local_d8;
  undefined1 local_90 [8];
  string msg_1;
  VkPipelineStageFlags DstStages;
  VkPipelineStageFlags SrcStages;
  bool HasMemoryBarrier;
  VkMemoryBarrier vkMemBarrier;
  undefined1 local_38 [8];
  string msg;
  VulkanCommandBuffer *this_local;
  
  msg.field_2._8_8_ = this;
  if ((((this->m_Barrier).MemorySrcStages != 0) || ((this->m_Barrier).MemoryDstStages != 0)) ||
     (bVar4 = std::vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>::empty
                        (&this->m_ImageBarriers), !bVar4)) {
    EndRenderScope(this);
    if (this->m_VkCmdBuffer == (VkCommandBuffer)0x0) {
      Diligent::FormatString<char[26],char[32]>
                ((string *)local_38,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"m_VkCmdBuffer != VK_NULL_HANDLE",in_RCX);
      pCVar7 = (Char *)std::__cxx11::string::c_str();
      Diligent::DebugAssertionFailed
                (pCVar7,"FlushBarriers",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanCommandBuffer.cpp"
                 ,0xf7);
      std::__cxx11::string::~string((string *)local_38);
    }
    memset(&SrcStages,0,0x18);
    SrcStages = 0x2e;
    vkMemBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    vkMemBarrier._4_4_ = 0;
    vkMemBarrier.pNext._0_4_ =
         (this->m_Barrier).MemorySrcAccess & (this->m_Barrier).SupportedAccessMask;
    vkMemBarrier.pNext._4_4_ =
         (this->m_Barrier).MemoryDstAccess & (this->m_Barrier).SupportedAccessMask;
    bVar4 = false;
    if ((((this->m_Barrier).MemorySrcStages != 0) &&
        (bVar4 = false, (this->m_Barrier).MemoryDstStages != 0)) &&
       (bVar4 = false, (this->m_Barrier).MemorySrcAccess != 0)) {
      bVar4 = (this->m_Barrier).MemoryDstAccess != 0;
    }
    uVar6 = ((this->m_Barrier).ImageSrcStages | (this->m_Barrier).MemorySrcStages) &
            (this->m_Barrier).SupportedStagesMask;
    msg_1.field_2._12_4_ =
         ((this->m_Barrier).ImageDstStages | (this->m_Barrier).MemoryDstStages) &
         (this->m_Barrier).SupportedStagesMask;
    if ((uVar6 == 0) || (msg_1.field_2._12_4_ == 0)) {
      Diligent::FormatString<char[26],char[33]>
                ((string *)local_90,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"SrcStages != 0 && DstStages != 0",(char (*) [33])this);
      pCVar7 = (Char *)std::__cxx11::string::c_str();
      Diligent::DebugAssertionFailed
                (pCVar7,"FlushBarriers",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanCommandBuffer.cpp"
                 ,0x105);
      std::__cxx11::string::~string((string *)local_90);
    }
    uVar3 = msg_1.field_2._12_4_;
    p_Var2 = vkCmdPipelineBarrier;
    pVVar1 = this->m_VkCmdBuffer;
    if (bVar4 == false) {
      local_d8 = (VkMemoryBarrier *)0x0;
    }
    else {
      local_d8 = (VkMemoryBarrier *)&SrcStages;
    }
    sVar8 = std::vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>::size
                      (&this->m_ImageBarriers);
    bVar5 = std::vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>::empty
                      (&this->m_ImageBarriers);
    if (bVar5) {
      local_f0 = (VkImageMemoryBarrier *)0x0;
    }
    else {
      local_f0 = std::vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>::data
                           (&this->m_ImageBarriers);
    }
    (*p_Var2)(pVVar1,uVar6,uVar3,0,SUB14(bVar4,0),local_d8,0,(VkBufferMemoryBarrier *)0x0,
              (uint32_t)sVar8,local_f0);
    std::vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>::clear
              (&this->m_ImageBarriers);
    (this->m_Barrier).ImageSrcStages = 0;
    (this->m_Barrier).ImageDstStages = 0;
    (this->m_Barrier).MemorySrcStages = 0;
    (this->m_Barrier).MemoryDstStages = 0;
    (this->m_Barrier).MemorySrcAccess = 0;
    (this->m_Barrier).MemoryDstAccess = 0;
  }
  return;
}

Assistant:

void VulkanCommandBuffer::FlushBarriers()
{
    if (m_Barrier.MemorySrcStages == 0 && m_Barrier.MemoryDstStages == 0 && m_ImageBarriers.empty())
        return;

    EndRenderScope();

    VERIFY_EXPR(m_VkCmdBuffer != VK_NULL_HANDLE);

    VkMemoryBarrier vkMemBarrier{};
    vkMemBarrier.sType         = VK_STRUCTURE_TYPE_MEMORY_BARRIER;
    vkMemBarrier.pNext         = nullptr;
    vkMemBarrier.srcAccessMask = m_Barrier.MemorySrcAccess & m_Barrier.SupportedAccessMask;
    vkMemBarrier.dstAccessMask = m_Barrier.MemoryDstAccess & m_Barrier.SupportedAccessMask;

    const bool HasMemoryBarrier =
        m_Barrier.MemorySrcStages != 0 && m_Barrier.MemoryDstStages != 0 &&
        m_Barrier.MemorySrcAccess != 0 && m_Barrier.MemoryDstAccess != 0;

    const VkPipelineStageFlags SrcStages = (m_Barrier.ImageSrcStages | m_Barrier.MemorySrcStages) & m_Barrier.SupportedStagesMask;
    const VkPipelineStageFlags DstStages = (m_Barrier.ImageDstStages | m_Barrier.MemoryDstStages) & m_Barrier.SupportedStagesMask;
    VERIFY_EXPR(SrcStages != 0 && DstStages != 0);

    vkCmdPipelineBarrier(m_VkCmdBuffer,
                         SrcStages,
                         DstStages,
                         0,
                         HasMemoryBarrier ? 1 : 0,
                         HasMemoryBarrier ? &vkMemBarrier : nullptr,
                         0,
                         nullptr,
                         static_cast<uint32_t>(m_ImageBarriers.size()),
                         m_ImageBarriers.empty() ? nullptr : m_ImageBarriers.data());

    m_ImageBarriers.clear();
    m_Barrier.ImageSrcStages  = 0;
    m_Barrier.ImageDstStages  = 0;
    m_Barrier.MemorySrcStages = 0;
    m_Barrier.MemoryDstStages = 0;
    m_Barrier.MemorySrcAccess = 0;
    m_Barrier.MemoryDstAccess = 0;
    // Do not clear SupportedStagesMask and SupportedAccessMask
}